

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-bind.c
# Opt level: O3

int run_test_udp_bind_reuseaddr(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_udp_t h2;
  uv_udp_t h1;
  long local_198;
  long local_190;
  undefined1 local_188 [16];
  long local_178 [23];
  long local_c0 [23];
  
  plVar3 = &local_198;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_188);
  local_c0[0] = (long)iVar1;
  local_178[0] = 0;
  if (local_c0[0] == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,local_c0);
    local_178[0] = (long)iVar1;
    local_198 = 0;
    if (local_178[0] != 0) goto LAB_001da010;
    iVar1 = uv_udp_init(uVar2,local_178);
    local_198 = (long)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001da01d;
    iVar1 = uv_udp_bind(local_c0,local_188,4);
    local_198 = (long)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001da02a;
    iVar1 = uv_udp_bind(local_178,local_188,4);
    local_198 = (long)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001da037;
    uv_close(local_c0,0);
    uv_close(local_178,0);
    iVar1 = uv_run(uVar2,0);
    local_198 = (long)iVar1;
    local_190 = 0;
    if (local_198 == 0) {
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_198 = 0;
      iVar1 = uv_loop_close(uVar2);
      local_190 = (long)iVar1;
      if (local_198 == local_190) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001da051;
    }
  }
  else {
    run_test_udp_bind_reuseaddr_cold_1();
LAB_001da010:
    run_test_udp_bind_reuseaddr_cold_2();
LAB_001da01d:
    run_test_udp_bind_reuseaddr_cold_3();
LAB_001da02a:
    run_test_udp_bind_reuseaddr_cold_4();
LAB_001da037:
    run_test_udp_bind_reuseaddr_cold_5();
  }
  run_test_udp_bind_reuseaddr_cold_6();
LAB_001da051:
  run_test_udp_bind_reuseaddr_cold_7();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_bind_reuseaddr) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_udp_t h1, h2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h1);
  ASSERT_OK(r);

  r = uv_udp_init(loop, &h2);
  ASSERT_OK(r);

  r = uv_udp_bind(&h1, (const struct sockaddr*) &addr, UV_UDP_REUSEADDR);
  ASSERT_OK(r);

  r = uv_udp_bind(&h2, (const struct sockaddr*) &addr, UV_UDP_REUSEADDR);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) &h1, NULL);
  uv_close((uv_handle_t*) &h2, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}